

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

size_t __thiscall Memory::Recycler::GetAllocSize(Recycler *this,size_t size)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined8 *in_FS_OFFSET;
  ulong local_20;
  size_t allocSize;
  size_t size_local;
  Recycler *this_local;
  
  BVar3 = VerifyEnabled(this);
  local_20 = size;
  if ((BVar3 != 0) && (local_20 = (ulong)this->verifyPad + 8 + size, local_20 <= size)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x465,"(allocSize > size)","allocSize > size");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  return local_20;
}

Assistant:

size_t Recycler::GetAllocSize(size_t size)
{
    size_t allocSize = size;
#ifdef RECYCLER_MEMORY_VERIFY
    if (this->VerifyEnabled())
    {
        allocSize += verifyPad + sizeof(size_t);
        Assert(allocSize > size);
    }
#endif

    return allocSize;
}